

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O2

void __thiscall SCCLiveness::ProcessRegDef(SCCLiveness *this,RegOpnd *regDef,Instr *instr)

{
  uint uVar1;
  StackSym *this_00;
  Opnd *this_01;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  uint32 uVar5;
  uint newUseValue;
  RegOpnd *pRVar6;
  undefined4 *puVar7;
  Lifetime *lifetime;
  
  this_00 = regDef->m_sym;
  if ((this_00 == (StackSym *)0x0) || (regDef->m_reg != RegNOREG)) {
    this_01 = instr->m_src1;
    bVar3 = LowererMD::IsAssign(instr);
    if ((bVar3) &&
       ((bVar3 = IR::Opnd::IsRegOpnd(this_01), bVar3 &&
        (pRVar6 = IR::Opnd::AsRegOpnd(this_01), pRVar6->m_sym != (StackSym *)0x0)))) {
      pRVar6 = IR::Opnd::AsRegOpnd(this_01);
      BVUnitT<unsigned_long>::Set
                ((BVUnitT<unsigned_long> *)((long)pRVar6->m_sym->scratch + 0x70),(uint)regDef->m_reg
                );
    }
    if (this_00 == (StackSym *)0x0) {
      return;
    }
  }
  bVar3 = StackSym::IsArgSlotSym(this_00);
  if (bVar3) {
    return;
  }
  lifetime = *(Lifetime **)&(this_00->scratch).globOpt;
  if (lifetime == (Lifetime *)0x0) {
    lifetime = InsertLifetime(this,this_00,regDef->m_reg,instr);
    lifetime->region = this->curRegion;
    uVar4 = 0x2000;
    if (1 < (byte)((regDef->super_Opnd).m_type - TyFloat32)) {
      bVar3 = IR::Opnd::IsSimd128(&regDef->super_Opnd);
      uVar4 = (ushort)bVar3 << 0xd;
    }
    *(ushort *)&lifetime->field_0x9c = uVar4 | (ushort)*(undefined4 *)&lifetime->field_0x9c & 0xdfff
    ;
  }
  else {
    uVar1 = lifetime->start;
    uVar5 = IR::Instr::GetNumber(instr);
    if (uVar5 < uVar1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                         ,0x294,"(lifetime->start <= instr->GetNumber())",
                         "Lifetime start not set correctly");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    ExtendLifetime(this,lifetime,instr);
    if ((lifetime->region != this->curRegion) && (bVar3 = Func::DoOptimizeTry(this->func), !bVar3))
    {
      lifetime->field_0x9d = lifetime->field_0x9d | 1;
    }
  }
  newUseValue = LinearScan::GetUseSpillCost
                          ((uint)this->loopNest,(uint)(this->lastOpHelperLabel != (LabelInstr *)0x0)
                          );
  Lifetime::AddToUseCount(lifetime,newUseValue,this->curLoop,this->func);
  BVUnitT<unsigned_long>::Set(&lifetime->intUsageBv,TySize[(regDef->super_Opnd).m_type]);
  return;
}

Assistant:

void
SCCLiveness::ProcessRegDef(IR::RegOpnd *regDef, IR::Instr *instr)
{
    StackSym * stackSym = regDef->m_sym;

    // PhysReg
    if (stackSym == nullptr || regDef->GetReg() != RegNOREG)
    {
        IR::Opnd *src = instr->GetSrc1();

        // If this symbol is assigned to a physical register, let's tell the register
        // allocator to prefer assigning that register to the lifetime.
        //
        // Note: this only pays off if this is the last-use of the symbol, but
        // unfortunately we don't have a way to tell that currently...
        if (LowererMD::IsAssign(instr) && src->IsRegOpnd() && src->AsRegOpnd()->m_sym)
        {
            StackSym *srcSym = src->AsRegOpnd()->m_sym;

            srcSym->scratch.linearScan.lifetime->regPreference.Set(regDef->GetReg());
        }

        // This physreg doesn't have a lifetime, just return.
        if (stackSym == nullptr)
        {
            return;
        }
    }

    // Arg slot sym can be in a RegOpnd for param passed via registers
    // Skip creating a lifetime for those.
    if (stackSym->IsArgSlotSym())
    {
        return;
    }

    // We'll extend the lifetime only if there are uses in a different loop region
    // from one of the defs.

    Lifetime * lifetime = stackSym->scratch.linearScan.lifetime;

    if (lifetime == nullptr)
    {
        lifetime = this->InsertLifetime(stackSym, regDef->GetReg(), instr);
        lifetime->region = this->curRegion;
        lifetime->isFloat = regDef->IsFloat() || regDef->IsSimd128();
    }
    else
    {
        AssertMsg(lifetime->start <= instr->GetNumber(), "Lifetime start not set correctly");

        ExtendLifetime(lifetime, instr);

        if (lifetime->region != this->curRegion && !this->func->DoOptimizeTry())
        {
            lifetime->dontAllocate = true;
        }
    }
    lifetime->AddToUseCount(LinearScan::GetUseSpillCost(this->loopNest, (this->lastOpHelperLabel != nullptr)), this->curLoop, this->func);
    lifetime->intUsageBv.Set(TySize[regDef->GetType()]);
}